

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O2

void ht_registry_deinit(void)

{
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < listeners_register.size; uVar1 = uVar1 + 1) {
    ht_timeline_listener_container_unref
              ((HT_TimelineListenerContainer *)listeners_register.data[uVar1]);
  }
  ht_mutex_destroy(features_register_mutex);
  ht_mutex_destroy(event_klass_registry_register_mutex);
  ht_mutex_destroy(listeners_register_mutex);
  ht_bag_void_ptr_deinit(&listeners_register);
  ht_bag_void_ptr_deinit(&event_klass_register);
  return;
}

Assistant:

void
ht_registry_deinit(void)
{
    size_t i;
    for (i = 0; i < listeners_register.size; i++)
    {
        ht_timeline_listener_container_unref((HT_TimelineListenerContainer*)listeners_register.data[i]);
    }

    ht_mutex_destroy(features_register_mutex);
    ht_mutex_destroy(event_klass_registry_register_mutex);
    ht_mutex_destroy(listeners_register_mutex);
    ht_bag_void_ptr_deinit(&listeners_register);
    ht_bag_void_ptr_deinit(&event_klass_register);
}